

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *pNtk,int fDuplicate)

{
  ulong uVar1;
  Abc_Obj_t *pDriver;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *__s1;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  char *__s2;
  Abc_Obj_t *pAVar9;
  int extraout_EDX;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  long lVar10;
  int iVar11;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x3c9,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar11 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar11 + 500;
    iVar5 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar5) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar5;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar11) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar5;
  }
  iVar11 = pNtk->nTravIds;
  pNtk->nTravIds = iVar11 + 1;
  if (0x3ffffffe < iVar11) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vCos;
  if (pVVar7->nSize < 1) {
    iVar11 = 0;
  }
  else {
    lVar10 = 0;
    iVar11 = 0;
    do {
      iVar5 = (int)in_RDX;
      pAVar9 = (Abc_Obj_t *)pVVar7->pArray[lVar10];
      pDriver = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
      if ((pAVar9->field_0x15 & 4) == 0) {
        uVar3 = *(uint *)&pDriver->field_0x14 & 0xf;
        if ((uVar3 == 5) || (uVar3 == 2)) {
          pcVar8 = Abc_ObjName(pDriver);
          __s2 = Abc_ObjName(pAVar9);
          iVar4 = strcmp(pcVar8,__s2);
          iVar5 = extraout_EDX;
          if (iVar4 != 0) {
            Abc_NtkFixCoDriverProblem(pDriver,pAVar9,fDuplicate);
            in_RDX = extraout_RDX_01;
            goto LAB_001f1148;
          }
        }
        pAVar2 = pDriver->pNtk;
        iVar4 = pDriver->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,iVar5);
        if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pAVar2->vTravIds).pArray[iVar4] == pDriver->pNtk->nTravIds) {
          __s1 = pDriver->pNext;
          pcVar8 = Abc_ObjName(pAVar9);
          iVar5 = strcmp((char *)__s1,pcVar8);
          in_RDX = extraout_RDX_03;
          if (iVar5 != 0) {
            Abc_NtkFixCoDriverProblem(pDriver,pAVar9,fDuplicate);
            iVar11 = iVar11 + 1;
            in_RDX = extraout_RDX_04;
          }
        }
        else {
          pAVar9 = (Abc_Obj_t *)Abc_ObjName(pAVar9);
          pDriver->pNext = pAVar9;
          pAVar2 = pDriver->pNtk;
          iVar5 = pAVar2->nTravIds;
          iVar4 = pDriver->Id;
          Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,Fill);
          if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pAVar2->vTravIds).pArray[iVar4] = iVar5;
          in_RDX = extraout_RDX_05;
        }
      }
      else {
        Abc_NtkFixCoDriverProblem(pDriver,pAVar9,fDuplicate);
        in_RDX = extraout_RDX_02;
LAB_001f1148:
        iVar11 = iVar11 + 1;
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar10 < pVVar7->nSize);
  }
  iVar5 = Abc_NtkLogicHasSimpleCos(pNtk);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkLogicHasSimpleCos(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x3eb,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  return iVar11;
}

Assistant:

int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate )
{
    Abc_Obj_t * pNode, * pDriver;
    int i, nDupGates = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
    }
    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    return nDupGates;
}